

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O2

int64_t __thiscall aeron::DriverProxy::removePublication(DriverProxy *this,int64_t registrationId)

{
  long *plVar1;
  int64_t correlationId;
  int64_t registrationId_local;
  anon_class_24_3_80c13eea local_20;
  
  local_20.registrationId = &registrationId_local;
  LOCK();
  plVar1 = (long *)(this->m_toDriverCommandBuffer->m_buffer->m_buffer +
                   this->m_toDriverCommandBuffer->m_correlationIdCounterIndex);
  correlationId = *plVar1;
  *plVar1 = *plVar1 + 1;
  UNLOCK();
  local_20.correlationId = &correlationId;
  registrationId_local = registrationId;
  local_20.this = this;
  writeCommandToDriver<aeron::DriverProxy::removePublication(long)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (this,&local_20);
  return correlationId;
}

Assistant:

std::int64_t removePublication(std::int64_t registrationId)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            RemoveMessageFlyweight removeMessage(buffer, 0);

            removeMessage.clientId(m_clientId);
            removeMessage.correlationId(correlationId);
            removeMessage.registrationId(registrationId);

            length = removeMessage.length();

            return ControlProtocolEvents::REMOVE_PUBLICATION;
        });

        return correlationId;
    }